

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DatabaseManager::GetDatabaseType
          (DatabaseManager *this,ClientContext *context,AttachInfo *info,DBConfig *config,
          AttachOptions *options)

{
  string *l1;
  char *pcVar1;
  bool bVar2;
  FileSystem *fs;
  string local_50;
  
  l1 = &options->db_type;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"DUCKDB","");
  bVar2 = StringUtil::CIEquals(l1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (char *)(options->db_type)._M_string_length;
  if (bVar2) {
    ::std::__cxx11::string::_M_replace((ulong)l1,0,pcVar1,0x14a89f1);
  }
  else {
    if (pcVar1 == (char *)0x0) {
      CheckPathConflict(this,context,&info->path);
      fs = FileSystem::GetFileSystem(context);
      DBPathAndType::CheckMagicBytes(fs,&info->path,l1);
    }
    if ((options->db_type)._M_string_length != 0) {
      bVar2 = Catalog::TryAutoLoad(context,l1);
      if (!bVar2) {
        ExtensionHelper::LoadExternalExtension(context,l1);
      }
    }
  }
  return;
}

Assistant:

void DatabaseManager::GetDatabaseType(ClientContext &context, AttachInfo &info, const DBConfig &config,
                                      AttachOptions &options) {

	// Test if the database is a DuckDB database file.
	if (StringUtil::CIEquals(options.db_type, "DUCKDB")) {
		options.db_type = "";
		return;
	}

	// Try to extract the database type from the path.
	if (options.db_type.empty()) {
		CheckPathConflict(context, info.path);

		auto &fs = FileSystem::GetFileSystem(context);
		DBPathAndType::CheckMagicBytes(fs, info.path, options.db_type);
	}

	// If we are loading a database type from an extension, then we need to check if that extension is loaded.
	if (!options.db_type.empty()) {
		if (!Catalog::TryAutoLoad(context, options.db_type)) {
			// FIXME: Here it might be preferable to use an AutoLoadOrThrow kind of function
			// so that either there will be success or a message to throw, and load will be
			// attempted only once respecting the auto-loading options
			ExtensionHelper::LoadExternalExtension(context, options.db_type);
		}
		return;
	}
}